

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

void __thiscall
gl3cts::ClipDistance::Utility::Program::Program
          (Program *this,Functions *gl,string *vertex_shader_code,string *fragment_shader_code,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transform_feedback_varyings)

{
  CompilationStatus *this_00;
  GLuint GVar1;
  GLchar *fragment_shader_code_c;
  GLchar *vertex_shader_code_c;
  pointer local_58;
  undefined1 local_50 [40];
  pointer local_28;
  
  (this->m_vertex_shader_status).shader_log._M_dataplus._M_p =
       (pointer)&(this->m_vertex_shader_status).shader_log.field_2;
  (this->m_vertex_shader_status).shader_log._M_string_length = 0;
  (this->m_vertex_shader_status).shader_log.field_2._M_local_buf[0] = '\0';
  (this->m_fragment_shader_status).shader_log._M_dataplus._M_p =
       (pointer)&(this->m_fragment_shader_status).shader_log.field_2;
  (this->m_fragment_shader_status).shader_log._M_string_length = 0;
  (this->m_fragment_shader_status).shader_log.field_2._M_local_buf[0] = '\0';
  (this->m_program_status).program_linkage_log._M_dataplus._M_p =
       (pointer)&(this->m_program_status).program_linkage_log.field_2;
  (this->m_program_status).program_linkage_log._M_string_length = 0;
  (this->m_program_status).program_linkage_log.field_2._M_local_buf[0] = '\0';
  this->m_gl = gl;
  local_28 = (vertex_shader_code->_M_dataplus)._M_p;
  local_58 = (fragment_shader_code->_M_dataplus)._M_p;
  compileShader((CompilationStatus *)local_50,this,0x8b31,&local_28);
  CompilationStatus::operator=(&this->m_vertex_shader_status,(CompilationStatus *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  compileShader((CompilationStatus *)local_50,this,0x8b30,&local_58);
  this_00 = &this->m_fragment_shader_status;
  CompilationStatus::operator=(this_00,(CompilationStatus *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  (this->m_program_status).program_id = 0;
  if (((this->m_vertex_shader_status).shader_compilation_status != 0) &&
     ((this->m_fragment_shader_status).shader_compilation_status != 0)) {
    linkShaders((LinkageStatus *)local_50,this,&this->m_vertex_shader_status,this_00,
                transform_feedback_varyings);
    LinkageStatus::operator=(&this->m_program_status,(LinkageStatus *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  GVar1 = (this->m_vertex_shader_status).shader_id;
  if (GVar1 != 0) {
    (*this->m_gl->deleteShader)(GVar1);
    (this->m_vertex_shader_status).shader_id = 0;
  }
  if (this_00->shader_id != 0) {
    (*this->m_gl->deleteShader)(this_00->shader_id);
    this_00->shader_id = 0;
  }
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::Program(const glw::Functions& gl, const std::string& vertex_shader_code,
												const std::string&		 fragment_shader_code,
												std::vector<std::string> transform_feedback_varyings)
	: m_gl(gl)
{
	/* Compilation */
	const glw::GLchar* vertex_shader_code_c   = (const glw::GLchar*)vertex_shader_code.c_str();
	const glw::GLchar* fragment_shader_code_c = (const glw::GLchar*)fragment_shader_code.c_str();

	m_vertex_shader_status   = compileShader(GL_VERTEX_SHADER, &vertex_shader_code_c);
	m_fragment_shader_status = compileShader(GL_FRAGMENT_SHADER, &fragment_shader_code_c);

	/* Linking */
	m_program_status.program_id = 0;
	if (m_vertex_shader_status.shader_compilation_status && m_fragment_shader_status.shader_compilation_status)
	{
		m_program_status = linkShaders(m_vertex_shader_status, m_fragment_shader_status, transform_feedback_varyings);
	}

	/* Cleaning */
	if (m_vertex_shader_status.shader_id)
	{
		m_gl.deleteShader(m_vertex_shader_status.shader_id);

		m_vertex_shader_status.shader_id = 0;
	}

	if (m_fragment_shader_status.shader_id)
	{
		m_gl.deleteShader(m_fragment_shader_status.shader_id);

		m_fragment_shader_status.shader_id = 0;
	}
}